

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rsa.cpp
# Opt level: O0

int mbedtls_rsa_private(mbedtls_rsa_context *ctx,_func_int_void_ptr_uchar_ptr_size_t *f_rng,
                       void *p_rng,uchar *input,uchar *output)

{
  int iVar1;
  long in_RSI;
  long in_RDI;
  mbedtls_mpi check_result_blinded;
  mbedtls_mpi input_blinded;
  mbedtls_mpi DQ_blind;
  mbedtls_mpi DP_blind;
  mbedtls_mpi TQ;
  mbedtls_mpi TP;
  mbedtls_mpi R;
  mbedtls_mpi Q1;
  mbedtls_mpi P1;
  mbedtls_mpi T;
  size_t olen;
  int ret;
  mbedtls_mpi *in_stack_ffffffffffffff18;
  int in_stack_ffffffffffffff20;
  int in_stack_ffffffffffffff24;
  mbedtls_rsa_context *in_stack_ffffffffffffff28;
  mbedtls_mpi *in_stack_ffffffffffffff30;
  mbedtls_mpi *in_stack_ffffffffffffff38;
  mbedtls_rsa_context *in_stack_ffffffffffffff40;
  mbedtls_mpi *in_stack_ffffffffffffff50;
  mbedtls_mpi *in_stack_ffffffffffffff58;
  mbedtls_mpi *in_stack_ffffffffffffff60;
  mbedtls_mpi *in_stack_ffffffffffffff68;
  mbedtls_mpi *in_stack_ffffffffffffff70;
  mbedtls_mpi local_80;
  mbedtls_mpi local_70;
  mbedtls_mpi local_60;
  mbedtls_mpi local_50;
  undefined8 local_40;
  int local_34;
  long local_10;
  int local_4;
  
  local_34 = 0xffffff92;
  if (in_RSI == 0) {
    local_4 = -0x4080;
  }
  else {
    local_10 = in_RDI;
    iVar1 = rsa_check_context(in_stack_ffffffffffffff28,in_stack_ffffffffffffff24,
                              in_stack_ffffffffffffff20);
    if (iVar1 == 0) {
      mbedtls_mpi_init(&local_50);
      mbedtls_mpi_init(&local_60);
      mbedtls_mpi_init(&local_70);
      mbedtls_mpi_init(&local_80);
      mbedtls_mpi_init((mbedtls_mpi *)&stack0xffffffffffffff50);
      mbedtls_mpi_init((mbedtls_mpi *)&stack0xffffffffffffff40);
      mbedtls_mpi_init((mbedtls_mpi *)&stack0xffffffffffffff70);
      mbedtls_mpi_init((mbedtls_mpi *)&stack0xffffffffffffff60);
      mbedtls_mpi_init((mbedtls_mpi *)&stack0xffffffffffffff30);
      mbedtls_mpi_init((mbedtls_mpi *)&stack0xffffffffffffff20);
      local_34 = mbedtls_mpi_read_binary
                           (in_stack_ffffffffffffff30,(uchar *)in_stack_ffffffffffffff28,
                            CONCAT44(in_stack_ffffffffffffff24,in_stack_ffffffffffffff20));
      if (local_34 == 0) {
        iVar1 = mbedtls_mpi_cmp_mpi(&local_50,(mbedtls_mpi *)(local_10 + 0x10));
        if (iVar1 < 0) {
          local_34 = rsa_prepare_blinding
                               (in_stack_ffffffffffffff40,
                                (_func_int_void_ptr_uchar_ptr_size_t *)in_stack_ffffffffffffff38,
                                in_stack_ffffffffffffff30);
          if (((((((local_34 == 0) &&
                  (local_34 = mbedtls_mpi_mul_mpi(in_stack_ffffffffffffff60,
                                                  in_stack_ffffffffffffff58,
                                                  in_stack_ffffffffffffff50), local_34 == 0)) &&
                 (local_34 = mbedtls_mpi_mod_mpi((mbedtls_mpi *)in_stack_ffffffffffffff28,
                                                 (mbedtls_mpi *)
                                                 CONCAT44(in_stack_ffffffffffffff24,
                                                          in_stack_ffffffffffffff20),
                                                 in_stack_ffffffffffffff18), local_34 == 0)) &&
                ((local_34 = mbedtls_mpi_copy((mbedtls_mpi *)in_stack_ffffffffffffff28,
                                              (mbedtls_mpi *)
                                              CONCAT44(in_stack_ffffffffffffff24,
                                                       in_stack_ffffffffffffff20)), local_34 == 0 &&
                 (local_34 = mbedtls_mpi_sub_int((mbedtls_mpi *)in_stack_ffffffffffffff40,
                                                 in_stack_ffffffffffffff38,
                                                 (mbedtls_mpi_sint)in_stack_ffffffffffffff30),
                 local_34 == 0)))) &&
               (((local_34 = mbedtls_mpi_sub_int((mbedtls_mpi *)in_stack_ffffffffffffff40,
                                                 in_stack_ffffffffffffff38,
                                                 (mbedtls_mpi_sint)in_stack_ffffffffffffff30),
                 local_34 == 0 &&
                 ((local_34 = mbedtls_mpi_fill_random
                                        (in_stack_ffffffffffffff38,(size_t)in_stack_ffffffffffffff30
                                         ,(_func_int_void_ptr_uchar_ptr_size_t *)
                                          in_stack_ffffffffffffff28,
                                         (void *)CONCAT44(in_stack_ffffffffffffff24,
                                                          in_stack_ffffffffffffff20)), local_34 == 0
                  && (local_34 = mbedtls_mpi_mul_mpi(in_stack_ffffffffffffff60,
                                                     in_stack_ffffffffffffff58,
                                                     in_stack_ffffffffffffff50), local_34 == 0))))
                && (local_34 = mbedtls_mpi_add_mpi((mbedtls_mpi *)
                                                   CONCAT44(in_stack_ffffffffffffff24,
                                                            in_stack_ffffffffffffff20),
                                                   in_stack_ffffffffffffff18,(mbedtls_mpi *)0x85f526
                                                  ), local_34 == 0)))) &&
              ((((local_34 = mbedtls_mpi_fill_random
                                       (in_stack_ffffffffffffff38,(size_t)in_stack_ffffffffffffff30,
                                        (_func_int_void_ptr_uchar_ptr_size_t *)
                                        in_stack_ffffffffffffff28,
                                        (void *)CONCAT44(in_stack_ffffffffffffff24,
                                                         in_stack_ffffffffffffff20)), local_34 == 0
                 && (local_34 = mbedtls_mpi_mul_mpi(in_stack_ffffffffffffff60,
                                                    in_stack_ffffffffffffff58,
                                                    in_stack_ffffffffffffff50), local_34 == 0)) &&
                (local_34 = mbedtls_mpi_add_mpi((mbedtls_mpi *)
                                                CONCAT44(in_stack_ffffffffffffff24,
                                                         in_stack_ffffffffffffff20),
                                                in_stack_ffffffffffffff18,(mbedtls_mpi *)0x85f5b1),
                local_34 == 0)) &&
               (((local_34 = mbedtls_mpi_exp_mod(in_stack_ffffffffffffff30,
                                                 (mbedtls_mpi *)in_stack_ffffffffffffff28,
                                                 (mbedtls_mpi *)
                                                 CONCAT44(in_stack_ffffffffffffff24,
                                                          in_stack_ffffffffffffff20),
                                                 in_stack_ffffffffffffff18,(mbedtls_mpi *)0x85f5f8),
                 local_34 == 0 &&
                 (local_34 = mbedtls_mpi_exp_mod(in_stack_ffffffffffffff30,
                                                 (mbedtls_mpi *)in_stack_ffffffffffffff28,
                                                 (mbedtls_mpi *)
                                                 CONCAT44(in_stack_ffffffffffffff24,
                                                          in_stack_ffffffffffffff20),
                                                 in_stack_ffffffffffffff18,(mbedtls_mpi *)0x85f63f),
                 local_34 == 0)) &&
                ((local_34 = mbedtls_mpi_sub_mpi((mbedtls_mpi *)
                                                 CONCAT44(in_stack_ffffffffffffff24,
                                                          in_stack_ffffffffffffff20),
                                                 in_stack_ffffffffffffff18,(mbedtls_mpi *)0x85f66b),
                 local_34 == 0 &&
                 ((local_34 = mbedtls_mpi_mul_mpi(in_stack_ffffffffffffff60,
                                                  in_stack_ffffffffffffff58,
                                                  in_stack_ffffffffffffff50), local_34 == 0 &&
                  (local_34 = mbedtls_mpi_mod_mpi((mbedtls_mpi *)in_stack_ffffffffffffff28,
                                                  (mbedtls_mpi *)
                                                  CONCAT44(in_stack_ffffffffffffff24,
                                                           in_stack_ffffffffffffff20),
                                                  in_stack_ffffffffffffff18), local_34 == 0)))))))))
              ) && ((local_34 = mbedtls_mpi_mul_mpi(in_stack_ffffffffffffff60,
                                                    in_stack_ffffffffffffff58,
                                                    in_stack_ffffffffffffff50), local_34 == 0 &&
                    ((local_34 = mbedtls_mpi_add_mpi((mbedtls_mpi *)
                                                     CONCAT44(in_stack_ffffffffffffff24,
                                                              in_stack_ffffffffffffff20),
                                                     in_stack_ffffffffffffff18,
                                                     (mbedtls_mpi *)0x85f733), local_34 == 0 &&
                     (local_34 = mbedtls_mpi_exp_mod(in_stack_ffffffffffffff30,
                                                     (mbedtls_mpi *)in_stack_ffffffffffffff28,
                                                     (mbedtls_mpi *)
                                                     CONCAT44(in_stack_ffffffffffffff24,
                                                              in_stack_ffffffffffffff20),
                                                     in_stack_ffffffffffffff18,
                                                     (mbedtls_mpi *)0x85f781), local_34 == 0)))))) {
            iVar1 = mbedtls_mpi_cmp_mpi((mbedtls_mpi *)&stack0xffffffffffffff20,
                                        (mbedtls_mpi *)&stack0xffffffffffffff30);
            if (iVar1 == 0) {
              local_34 = rsa_unblind(in_stack_ffffffffffffff70,in_stack_ffffffffffffff68,
                                     in_stack_ffffffffffffff60);
              if (local_34 == 0) {
                local_40 = *(undefined8 *)(local_10 + 8);
                local_34 = mbedtls_mpi_write_binary
                                     ((mbedtls_mpi *)
                                      CONCAT44(in_stack_ffffffffffffff24,in_stack_ffffffffffffff20),
                                      (uchar *)in_stack_ffffffffffffff18,0x85f820);
              }
            }
            else {
              local_34 = -0x4380;
            }
          }
        }
        else {
          local_34 = -4;
        }
      }
      mbedtls_mpi_free((mbedtls_mpi *)0x85f83f);
      mbedtls_mpi_free((mbedtls_mpi *)0x85f849);
      mbedtls_mpi_free((mbedtls_mpi *)0x85f853);
      mbedtls_mpi_free((mbedtls_mpi *)0x85f85d);
      mbedtls_mpi_free((mbedtls_mpi *)0x85f867);
      mbedtls_mpi_free((mbedtls_mpi *)0x85f874);
      mbedtls_mpi_free((mbedtls_mpi *)0x85f87e);
      mbedtls_mpi_free((mbedtls_mpi *)0x85f888);
      mbedtls_mpi_free((mbedtls_mpi *)0x85f892);
      mbedtls_mpi_free((mbedtls_mpi *)0x85f89c);
      if ((local_34 == 0) || (local_34 < -0x7f)) {
        local_4 = local_34;
      }
      else {
        local_4 = mbedtls_error_add(-0x4300,local_34,
                                    "/workspace/llm4binary/github/license_c_cmakelists/duckdb[P]duckdb/third_party/mbedtls/library/rsa.cpp"
                                    ,0x642);
      }
    }
    else {
      local_4 = -0x4080;
    }
  }
  return local_4;
}

Assistant:

int mbedtls_rsa_private(mbedtls_rsa_context *ctx,
                        int (*f_rng)(void *, unsigned char *, size_t),
                        void *p_rng,
                        const unsigned char *input,
                        unsigned char *output)
{
    int ret = MBEDTLS_ERR_ERROR_CORRUPTION_DETECTED;
    size_t olen;

    /* Temporary holding the result */
    mbedtls_mpi T;

    /* Temporaries holding P-1, Q-1 and the
     * exponent blinding factor, respectively. */
    mbedtls_mpi P1, Q1, R;

#if !defined(MBEDTLS_RSA_NO_CRT)
    /* Temporaries holding the results mod p resp. mod q. */
    mbedtls_mpi TP, TQ;

    /* Temporaries holding the blinded exponents for
     * the mod p resp. mod q computation (if used). */
    mbedtls_mpi DP_blind, DQ_blind;
#else
    /* Temporary holding the blinded exponent (if used). */
    mbedtls_mpi D_blind;
#endif /* MBEDTLS_RSA_NO_CRT */

    /* Temporaries holding the initial input and the double
     * checked result; should be the same in the end. */
    mbedtls_mpi input_blinded, check_result_blinded;

    if (f_rng == NULL) {
        return MBEDTLS_ERR_RSA_BAD_INPUT_DATA;
    }

    if (rsa_check_context(ctx, 1 /* private key checks */,
                          1 /* blinding on        */) != 0) {
        return MBEDTLS_ERR_RSA_BAD_INPUT_DATA;
    }

#if defined(MBEDTLS_THREADING_C)
    if ((ret = mbedtls_mutex_lock(&ctx->mutex)) != 0) {
        return ret;
    }
#endif

    /* MPI Initialization */
    mbedtls_mpi_init(&T);

    mbedtls_mpi_init(&P1);
    mbedtls_mpi_init(&Q1);
    mbedtls_mpi_init(&R);

#if defined(MBEDTLS_RSA_NO_CRT)
    mbedtls_mpi_init(&D_blind);
#else
    mbedtls_mpi_init(&DP_blind);
    mbedtls_mpi_init(&DQ_blind);
#endif

#if !defined(MBEDTLS_RSA_NO_CRT)
    mbedtls_mpi_init(&TP); mbedtls_mpi_init(&TQ);
#endif

    mbedtls_mpi_init(&input_blinded);
    mbedtls_mpi_init(&check_result_blinded);

    /* End of MPI initialization */

    MBEDTLS_MPI_CHK(mbedtls_mpi_read_binary(&T, input, ctx->len));
    if (mbedtls_mpi_cmp_mpi(&T, &ctx->N) >= 0) {
        ret = MBEDTLS_ERR_MPI_BAD_INPUT_DATA;
        goto cleanup;
    }

    /*
     * Blinding
     * T = T * Vi mod N
     */
    MBEDTLS_MPI_CHK(rsa_prepare_blinding(ctx, f_rng, p_rng));
    MBEDTLS_MPI_CHK(mbedtls_mpi_mul_mpi(&T, &T, &ctx->Vi));
    MBEDTLS_MPI_CHK(mbedtls_mpi_mod_mpi(&T, &T, &ctx->N));

    MBEDTLS_MPI_CHK(mbedtls_mpi_copy(&input_blinded, &T));

    /*
     * Exponent blinding
     */
    MBEDTLS_MPI_CHK(mbedtls_mpi_sub_int(&P1, &ctx->P, 1));
    MBEDTLS_MPI_CHK(mbedtls_mpi_sub_int(&Q1, &ctx->Q, 1));

#if defined(MBEDTLS_RSA_NO_CRT)
    /*
     * D_blind = ( P - 1 ) * ( Q - 1 ) * R + D
     */
    MBEDTLS_MPI_CHK(mbedtls_mpi_fill_random(&R, RSA_EXPONENT_BLINDING,
                                            f_rng, p_rng));
    MBEDTLS_MPI_CHK(mbedtls_mpi_mul_mpi(&D_blind, &P1, &Q1));
    MBEDTLS_MPI_CHK(mbedtls_mpi_mul_mpi(&D_blind, &D_blind, &R));
    MBEDTLS_MPI_CHK(mbedtls_mpi_add_mpi(&D_blind, &D_blind, &ctx->D));
#else
    /*
     * DP_blind = ( P - 1 ) * R + DP
     */
    MBEDTLS_MPI_CHK(mbedtls_mpi_fill_random(&R, RSA_EXPONENT_BLINDING,
                                            f_rng, p_rng));
    MBEDTLS_MPI_CHK(mbedtls_mpi_mul_mpi(&DP_blind, &P1, &R));
    MBEDTLS_MPI_CHK(mbedtls_mpi_add_mpi(&DP_blind, &DP_blind,
                                        &ctx->DP));

    /*
     * DQ_blind = ( Q - 1 ) * R + DQ
     */
    MBEDTLS_MPI_CHK(mbedtls_mpi_fill_random(&R, RSA_EXPONENT_BLINDING,
                                            f_rng, p_rng));
    MBEDTLS_MPI_CHK(mbedtls_mpi_mul_mpi(&DQ_blind, &Q1, &R));
    MBEDTLS_MPI_CHK(mbedtls_mpi_add_mpi(&DQ_blind, &DQ_blind,
                                        &ctx->DQ));
#endif /* MBEDTLS_RSA_NO_CRT */

#if defined(MBEDTLS_RSA_NO_CRT)
    MBEDTLS_MPI_CHK(mbedtls_mpi_exp_mod(&T, &T, &D_blind, &ctx->N, &ctx->RN));
#else
    /*
     * Faster decryption using the CRT
     *
     * TP = input ^ dP mod P
     * TQ = input ^ dQ mod Q
     */

    MBEDTLS_MPI_CHK(mbedtls_mpi_exp_mod(&TP, &T, &DP_blind, &ctx->P, &ctx->RP));
    MBEDTLS_MPI_CHK(mbedtls_mpi_exp_mod(&TQ, &T, &DQ_blind, &ctx->Q, &ctx->RQ));

    /*
     * T = (TP - TQ) * (Q^-1 mod P) mod P
     */
    MBEDTLS_MPI_CHK(mbedtls_mpi_sub_mpi(&T, &TP, &TQ));
    MBEDTLS_MPI_CHK(mbedtls_mpi_mul_mpi(&TP, &T, &ctx->QP));
    MBEDTLS_MPI_CHK(mbedtls_mpi_mod_mpi(&T, &TP, &ctx->P));

    /*
     * T = TQ + T * Q
     */
    MBEDTLS_MPI_CHK(mbedtls_mpi_mul_mpi(&TP, &T, &ctx->Q));
    MBEDTLS_MPI_CHK(mbedtls_mpi_add_mpi(&T, &TQ, &TP));
#endif /* MBEDTLS_RSA_NO_CRT */

    /* Verify the result to prevent glitching attacks. */
    MBEDTLS_MPI_CHK(mbedtls_mpi_exp_mod(&check_result_blinded, &T, &ctx->E,
                                        &ctx->N, &ctx->RN));
    if (mbedtls_mpi_cmp_mpi(&check_result_blinded, &input_blinded) != 0) {
        ret = MBEDTLS_ERR_RSA_VERIFY_FAILED;
        goto cleanup;
    }

    /*
     * Unblind
     * T = T * Vf mod N
     */
    MBEDTLS_MPI_CHK(rsa_unblind(&T, &ctx->Vf, &ctx->N));

    olen = ctx->len;
    MBEDTLS_MPI_CHK(mbedtls_mpi_write_binary(&T, output, olen));

cleanup:
#if defined(MBEDTLS_THREADING_C)
    if (mbedtls_mutex_unlock(&ctx->mutex) != 0) {
        return MBEDTLS_ERR_THREADING_MUTEX_ERROR;
    }
#endif

    mbedtls_mpi_free(&P1);
    mbedtls_mpi_free(&Q1);
    mbedtls_mpi_free(&R);

#if defined(MBEDTLS_RSA_NO_CRT)
    mbedtls_mpi_free(&D_blind);
#else
    mbedtls_mpi_free(&DP_blind);
    mbedtls_mpi_free(&DQ_blind);
#endif

    mbedtls_mpi_free(&T);

#if !defined(MBEDTLS_RSA_NO_CRT)
    mbedtls_mpi_free(&TP); mbedtls_mpi_free(&TQ);
#endif

    mbedtls_mpi_free(&check_result_blinded);
    mbedtls_mpi_free(&input_blinded);

    if (ret != 0 && ret >= -0x007f) {
        return MBEDTLS_ERROR_ADD(MBEDTLS_ERR_RSA_PRIVATE_FAILED, ret);
    }

    return ret;
}